

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

wchar_t read_body_to_string(archive_read *a,tar *tar,archive_string *as,void *h,int64_t *unconsumed)

{
  ulong size_00;
  ulong request;
  ulong uVar1;
  int64_t to_consume;
  wchar_t r;
  archive_entry_header_ustar *header;
  int64_t size;
  int64_t *unconsumed_local;
  void *h_local;
  archive_string *as_local;
  tar *tar_local;
  archive_read *a_local;
  
  size_00 = tar_atol((char *)((long)h + 0x7c),0xc);
  if ((long)size_00 < 0x1000000000000000) {
    if (((long)size_00 < 0x100001) && (-1 < (long)size_00)) {
      a_local._4_4_ = read_bytes_to_string(a,as,size_00,unconsumed);
      *unconsumed = (-size_00 & 0x1ff) + *unconsumed;
    }
    else {
      as->length = 0;
      request = size_00 + 0x1ff & 0xfffffffffffffe00;
      uVar1 = __archive_read_consume(a,request);
      if (request == uVar1) {
        archive_set_error(&a->archive,0x16,"Special header too large: %d > 1MiB",
                          size_00 & 0xffffffff);
        a_local._4_4_ = L'\xffffffec';
      }
      else {
        a_local._4_4_ = L'\xffffffe2';
      }
    }
  }
  else {
    a_local._4_4_ = L'\xffffffe2';
  }
  return a_local._4_4_;
}

Assistant:

static int
read_body_to_string(struct archive_read *a, struct tar *tar,
    struct archive_string *as, const void *h, int64_t *unconsumed)
{
	int64_t size;
	const struct archive_entry_header_ustar *header;
	int r;

	(void)tar; /* UNUSED */
	header = (const struct archive_entry_header_ustar *)h;
	size  = tar_atol(header->size, sizeof(header->size));
	if (size > entry_limit) {
		return (ARCHIVE_FATAL);
	}
	if ((size > (int64_t)pathname_limit) || (size < 0)) {
		archive_string_empty(as);
		int64_t to_consume = ((size + 511) & ~511);
		if (to_consume != __archive_read_consume(a, to_consume)) {
			return (ARCHIVE_FATAL);
		}
		archive_set_error(&a->archive, EINVAL,
		    "Special header too large: %d > 1MiB",
		    (int)size);
		return (ARCHIVE_WARN);
	}
	r = read_bytes_to_string(a, as, size, unconsumed);
	*unconsumed += 0x1ff & (-size);
	return(r);
}